

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servls.cpp
# Opt level: O3

UnicodeString * __thiscall icu_63::ICULocaleService::validateFallbackLocale(ICULocaleService *this)

{
  UBool UVar1;
  Locale *this_00;
  
  this_00 = Locale::getDefault();
  umtx_lock_63((UMutex *)llock);
  UVar1 = Locale::operator==(this_00,&this->fallbackLocale);
  if (UVar1 == '\0') {
    Locale::operator=(&this->fallbackLocale,this_00);
    LocaleUtility::initNameFromLocale(this_00,&this->fallbackLocaleName);
    ICUService::clearServiceCache(&this->super_ICUService);
  }
  umtx_unlock_63((UMutex *)llock);
  return &this->fallbackLocaleName;
}

Assistant:

const UnicodeString&
ICULocaleService::validateFallbackLocale() const
{
    const Locale&     loc    = Locale::getDefault();
    ICULocaleService* ncThis = (ICULocaleService*)this;
    {
        Mutex mutex(&llock);
        if (loc != fallbackLocale) {
            ncThis->fallbackLocale = loc;
            LocaleUtility::initNameFromLocale(loc, ncThis->fallbackLocaleName);
            ncThis->clearServiceCache();
        }
    }
    return fallbackLocaleName;
}